

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_head.h
# Opt level: O1

void anon_unknown.dwarf_8140d::buildAndAssert_Elements_Multiple(int elements)

{
  _List_node_base *p_Var1;
  int iVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  cell cVar5;
  ulong uVar6;
  undefined8 extraout_RAX;
  ulong uVar7;
  char *in_R9;
  uint uVar8;
  uint column_00;
  uint column;
  uint uVar9;
  internal iVar10;
  internal iVar11;
  double dVar12;
  double dVar13;
  AssertionResult gtest_ar_;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> elements_1;
  SudokuGitter gitter;
  SudokuGenerator generator;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  internal local_1a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  undefined1 local_198 [32];
  _Base_ptr local_178;
  ulong local_170;
  AssertHelper local_168;
  int local_15c;
  double local_158;
  double local_150;
  ulong local_148;
  int local_13c;
  uint local_138;
  int local_134;
  double local_130;
  ulong local_128;
  ulong local_120;
  SudokuGitter local_118;
  SudokuGitter local_f0;
  SudokuGitter local_c8;
  SudokuGitter local_a0;
  SudokuGenerator local_78;
  
  iVar11 = (internal)(elements == 0);
  local_148 = (ulong)(uint)elements;
  local_158 = (double)local_148;
  local_130 = SQRT(local_158);
  local_13c = 0;
  do {
    SudokuGenerator::SudokuGenerator(&local_78,elements);
    SudokuGenerator::generateNew(&local_118,&local_78);
    std::
    vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ::vector(&local_a0.cells,&local_118.cells);
    local_a0.quadHeight = local_118.quadHeight;
    local_a0.elements = local_118.elements;
    local_a0.quadWidth = local_118.quadWidth;
    iVar10 = iVar11;
    if (elements != 0) {
      iVar10 = (internal)0x0;
      uVar8 = 0;
      do {
        local_198._8_4_ = _S_red;
        local_198._16_8_ = (_Base_ptr)0x0;
        local_198._24_8_ = local_198 + 8;
        local_170 = 0;
        uVar9 = 0;
        local_178 = (_Base_ptr)local_198._24_8_;
        do {
          cVar5 = SudokuGitter::getCell(&local_a0,uVar8,uVar9);
          local_1b0.ptr_._0_5_ = cVar5._0_5_;
          if (cVar5.value != 0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)local_198,(uint *)&local_1b0);
          }
          uVar9 = uVar9 + 1;
        } while (elements != uVar9);
        if (local_170 != local_148) {
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)local_198);
          break;
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::clear((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_198);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_198);
        uVar8 = uVar8 + 1;
        iVar10 = (internal)((uint)elements <= uVar8);
      } while (uVar8 != elements);
    }
    local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1a8[0] = iVar10;
    std::
    vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ::~vector(&local_a0.cells);
    if (local_1a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_198,local_1a8,(AssertionResult *)"checkRows(gitter, size)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ob-algdatii-ss18[P]leistungsnachweis-algo/test/test_head.h"
                 ,0x61,(char *)local_198._0_8_);
      testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_);
      }
      if (local_1b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_1b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1b0.ptr_ + 8))();
        }
        local_1b0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      std::
      vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
      ::vector(&local_c8.cells,&local_118.cells);
      local_c8.quadHeight = local_118.quadHeight;
      local_c8.elements = local_118.elements;
      local_c8.quadWidth = local_118.quadWidth;
      iVar10 = iVar11;
      if (elements != 0) {
        iVar10 = (internal)0x0;
        uVar8 = 0;
        do {
          local_198._8_4_ = _S_red;
          local_198._16_8_ = (_Base_ptr)0x0;
          local_198._24_8_ = local_198 + 8;
          local_170 = 0;
          uVar9 = 0;
          local_178 = (_Base_ptr)local_198._24_8_;
          do {
            cVar5 = SudokuGitter::getCell(&local_c8,uVar9,uVar8);
            if (cVar5.value != 0) {
              local_1b0.ptr_._0_4_ = cVar5.value;
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_insert_unique<int>
                        ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          *)local_198,(int *)&local_1b0);
            }
            uVar9 = uVar9 + 1;
          } while (elements != uVar9);
          if (local_170 != local_148) {
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)local_198);
            break;
          }
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                    ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)local_198);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )local_198);
          uVar8 = uVar8 + 1;
          iVar10 = (internal)((uint)elements <= uVar8);
        } while (uVar8 != elements);
      }
      local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_1a8[0] = iVar10;
      std::
      vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
      ::~vector(&local_c8.cells);
      if (local_1a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_1b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_198,local_1a8,(AssertionResult *)"checkColumns(gitter, size)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_168,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ob-algdatii-ss18[P]leistungsnachweis-algo/test/test_head.h"
                   ,0x62,(char *)local_198._0_8_);
        testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_168);
        if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
          operator_delete((void *)local_198._0_8_);
        }
        if (local_1b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_1b0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1b0.ptr_ + 8))();
          }
          local_1b0.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        std::
        vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
        ::vector(&local_f0.cells,&local_118.cells);
        local_f0.quadHeight = local_118.quadHeight;
        local_f0.elements = local_118.elements;
        local_f0.quadWidth = local_118.quadWidth;
        dVar12 = local_130;
        if (local_158 < 0.0) {
          dVar12 = sqrt(local_158);
        }
        dVar13 = local_130;
        if (local_158 < 0.0) {
          local_150 = dVar12;
          dVar13 = sqrt(local_158);
          dVar12 = local_150;
        }
        local_120 = (ulong)dVar13;
        local_15c = (int)((ulong)(uint)elements / (local_120 & 0xffffffff));
        uVar6 = (ulong)(byte)iVar11;
        if (elements != 0) {
          local_128 = (ulong)dVar12;
          uVar6 = 0;
          uVar7 = 0;
          do {
            local_138 = (uint)uVar6;
            local_198._8_4_ = _S_red;
            local_198._16_8_ = (_Base_ptr)0x0;
            local_198._24_8_ = local_198 + 8;
            local_170 = 0;
            local_134 = (int)uVar7;
            uVar8 = (uint)(local_134 * local_15c) % (uint)elements;
            local_150 = (double)CONCAT44(local_150._4_4_,uVar8);
            uVar6 = local_128 & 0xffffffff;
            uVar9 = local_134 - (int)(uVar7 % uVar6);
            iVar2 = (int)local_128;
            local_178 = (_Base_ptr)local_198._24_8_;
            if (uVar9 < iVar2 + uVar9) {
              uVar8 = uVar8 + local_15c;
              do {
                column_00 = local_150._0_4_;
                if ((uint)local_120 <= (uint)elements) {
                  do {
                    cVar5 = SudokuGitter::getCell(&local_f0,uVar9,column_00);
                    if (cVar5.value != 0) {
                      local_1b0.ptr_._0_4_ = cVar5.value;
                      std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::_M_insert_unique<int>
                                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                  *)local_198,(int *)&local_1b0);
                    }
                    column_00 = column_00 + 1;
                  } while (column_00 < uVar8);
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != ((int)(uVar7 / uVar6) + 1) * iVar2);
            }
            if (local_170 != local_148) {
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                         *)local_198);
              uVar6 = (ulong)local_138;
              break;
            }
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            clear((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_198);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)local_198);
            uVar8 = local_134 + 1;
            uVar7 = (ulong)uVar8;
            uVar6 = CONCAT71((int7)((ulong)extraout_RAX >> 8),(uint)elements <= uVar8);
          } while (uVar8 != elements);
        }
        local_1a8[0] = (internal)((byte)uVar6 & 1);
        local_1a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::
        vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
        ::~vector(&local_f0.cells);
        if (local_1a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_198,local_1a8,(AssertionResult *)"checkQuad(gitter, size)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_168,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ob-algdatii-ss18[P]leistungsnachweis-algo/test/test_head.h"
                     ,99,(char *)local_198._0_8_);
          testing::internal::AssertHelper::operator=(&local_168,(Message *)&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_168);
          if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
            operator_delete((void *)local_198._0_8_);
          }
          if (local_1b0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               (local_1b0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1b0.ptr_ + 8))();
            }
            local_1b0.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
    }
    std::
    vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ::~vector(&local_118.cells);
    std::
    vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ::~vector(&local_78.gitter.cells);
    p_Var3 = local_78.errorInRow.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)&local_78.errorInRow) {
      p_Var1 = p_Var3->_M_next;
      operator_delete(p_Var3);
      p_Var3 = p_Var1;
    }
    local_13c = local_13c + 1;
    if (local_13c == 10) {
      return;
    }
  } while( true );
}

Assistant:

static void buildAndAssert_Elements_Multiple(int elements) {
        for (unsigned int run = 0; run < RUNS; run++) {
            buildAndAssert_Elements(elements);
        }
    }